

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O0

TPZFYsmpMatrix<std::complex<float>_> * __thiscall
TPZFYsmpMatrix<std::complex<float>_>::operator+
          (TPZFYsmpMatrix<std::complex<float>_> *this,TPZFYsmpMatrix<std::complex<float>_> *mat)

{
  int64_t iVar1;
  long in_RDX;
  complex<float> *in_RSI;
  TPZFYsmpMatrix<std::complex<float>_> *in_RDI;
  int i;
  int64_t sizeA;
  TPZFYsmpMatrix<std::complex<float>_> *res;
  TPZFYsmpMatrix<std::complex<float>_> *__z;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffcc;
  TPZFYsmpMatrix<std::complex<float>_> *in_stack_ffffffffffffffd0;
  
  __z = in_RDI;
  (**(code **)(in_RSI->_M_value + 0x250))(in_RSI,in_RSI,in_RDX);
  TPZFYsmpMatrix(in_stack_ffffffffffffffd0,
                 (TPZFYsmpMatrix<std::complex<float>_> *)
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar1 = TPZVec<std::complex<float>_>::size(&in_RDI->fA);
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    TPZVec<std::complex<float>_>::operator[]
              ((TPZVec<std::complex<float>_> *)(in_RDX + 0x60),(long)iVar2);
    TPZVec<std::complex<float>_>::operator[](&in_RDI->fA,(long)iVar2);
    std::complex<float>::operator+=(in_RSI,(complex<float> *)__z);
  }
  return __z;
}

Assistant:

TPZFYsmpMatrix<TVar> TPZFYsmpMatrix<TVar>::operator+(const TPZFYsmpMatrix<TVar>&mat) const
{
	CheckTypeCompatibility(this,&mat);
	auto res(*this);
  const auto sizeA = res.fA.size();
  for(auto i = 0; i < sizeA; i++) res.fA[i] += mat.fA[i];
	return res;
}